

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O0

Memory * __thiscall wabt::Module::GetMemory(Module *this,Var *var)

{
  Memory *pMVar1;
  Var *var_local;
  Module *this_local;
  
  pMVar1 = GetMemory(this,var);
  return pMVar1;
}

Assistant:

const Memory* Module::GetMemory(const Var& var) const {
  return const_cast<Module*>(this)->GetMemory(var);
}